

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRUndef * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::allocate<unsigned_int&>
          (ObjectPool<diligent_spirv_cross::SPIRUndef> *this,uint *p)

{
  Vector<diligent_spirv_cross::SPIRUndef_*> *this_00;
  uint uVar1;
  SPIRUndef *pSVar2;
  size_t sVar3;
  ulong count;
  bool bVar4;
  SPIRUndef *ptr;
  SPIRUndef *local_40;
  SPIRUndef *local_38;
  
  this_00 = &this->vacants;
  sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.buffer_size;
  if (sVar3 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRUndef,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar2 = (SPIRUndef *)malloc(count << 4);
    if (pSVar2 == (SPIRUndef *)0x0) {
      return (SPIRUndef *)0x0;
    }
    local_38 = pSVar2;
    SmallVector<diligent_spirv_cross::SPIRUndef_*,_0UL>::reserve(this_00,count);
    while (bVar4 = count != 0, count = count - 1, bVar4) {
      local_40 = pSVar2;
      SmallVector<diligent_spirv_cross::SPIRUndef_*,_0UL>::push_back(this_00,&local_40);
      pSVar2 = pSVar2 + 1;
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRUndef,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRUndef*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRUndef,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRUndef>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar3 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRUndef_*>.buffer_size;
  }
  pSVar2 = (this_00->super_VectorView<diligent_spirv_cross::SPIRUndef_*>).ptr[sVar3 - 1];
  SmallVector<diligent_spirv_cross::SPIRUndef_*,_0UL>::pop_back(this_00);
  uVar1 = *p;
  (pSVar2->super_IVariant).self.id = 0;
  (pSVar2->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_00ac3500;
  *(uint *)&(pSVar2->super_IVariant).field_0xc = uVar1;
  return pSVar2;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}